

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::StrengthReductionPass::Process(StrengthReductionPass *this)

{
  bool bVar1;
  Status SVar2;
  bool modified;
  StrengthReductionPass *this_local;
  
  *(undefined4 *)&(this->super_Pass).field_0x34 = 0;
  this->uint32_type_id_ = 0;
  memset(this->constant_ids_,0,0x84);
  FindIntTypesAndConstants(this);
  bVar1 = ScanFunctions(this);
  SVar2 = SuccessWithoutChange;
  if (bVar1) {
    SVar2 = SuccessWithChange;
  }
  return SVar2;
}

Assistant:

Pass::Status StrengthReductionPass::Process() {
  // Initialize the member variables on a per module basis.
  bool modified = false;
  int32_type_id_ = 0;
  uint32_type_id_ = 0;
  std::memset(constant_ids_, 0, sizeof(constant_ids_));

  FindIntTypesAndConstants();
  modified = ScanFunctions();
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}